

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_single.h
# Opt level: O2

Allocation * __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::consistency_model)1>
::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)3,1ul,true,16ul,8ul>
          (Allocation *__return_storage_ptr__,void *this)

{
  LfQueueControl *i_atomic;
  uintptr_t uVar1;
  ulong uVar2;
  void *pvVar3;
  uintptr_t *i_atomic_00;
  
  while( true ) {
    uVar2 = *this;
    if (uVar2 == 0 || (uVar2 & 0x3f) != 0) {
      density_tests::detail::assert_failed<>
                ("m_tail != 0 && uint_is_aligned(m_tail, s_alloc_granularity)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_single.h"
                 ,0xeb);
      uVar2 = *this;
    }
    i_atomic_00 = (uintptr_t *)(uVar2 + 0x5f & 0xffffffffffffffc0);
    if ((long)i_atomic_00 - (uVar2 & 0xffffffffffff0000) < 0xffc1) break;
    uVar1 = LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::page_overflow((LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                             *)this,LfQueue_WaitFree);
    if (uVar1 == 0) {
      pvVar3 = (void *)0x0;
LAB_00eb0990:
      __return_storage_ptr__->m_user_storage = pvVar3;
      return __return_storage_ptr__;
    }
  }
  raw_atomic_store(i_atomic_00,0,memory_order_seq_cst);
  i_atomic = *this;
  uVar1 = raw_atomic_load(&i_atomic->m_next,memory_order_seq_cst);
  if (uVar1 != 0) {
    density_tests::detail::assert_failed<>
              ("raw_atomic_load(&new_block->m_next, mem_relaxed) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_single.h"
               ,0x10f);
  }
  pvVar3 = (void *)(uVar2 + 0x10);
  raw_atomic_store(&i_atomic->m_next,(ulong)i_atomic_00 | 1,memory_order_seq_cst);
  *(uintptr_t **)this = i_atomic_00;
  __return_storage_ptr__->m_control_block = i_atomic;
  __return_storage_ptr__->m_next_ptr = (ulong)i_atomic_00 | 1;
  goto LAB_00eb0990;
}

Assistant:

Allocation try_inplace_allocate_impl() noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee =
                  PROGRESS_GUARANTEE; // used to avoid warnings about constant conditional expressions

                static_assert(
                  (CONTROL_BITS & ~(LfQueue_Dead | LfQueue_External | LfQueue_Busy)) == 0,
                  "internal error");
                static_assert(
                  is_power_of_2(ALIGNMENT) && (SIZE % ALIGNMENT) == 0, "internal error");

                constexpr size_t alignment = size_max(ALIGNMENT, min_alignment);
                constexpr size_t size      = uint_upper_align(SIZE, alignment);
                constexpr bool   can_fit_in_a_page =
                  size + (alignment - min_alignment) <= s_max_size_inpage;
                constexpr bool over_aligned = alignment > min_alignment;

                for (;;)
                {
                    DENSITY_ASSERT_INTERNAL(
                      m_tail != 0 && uint_is_aligned(m_tail, s_alloc_granularity));

                    // allocate space for the control block (and possibly the runtime type)
                    auto new_tail =
                      m_tail + (INCLUDE_TYPE ? s_element_min_offset : s_rawblock_min_offset);

                    // allocate the user space
                    if (over_aligned)
                        new_tail = uint_upper_align(new_tail, alignment);
                    DENSITY_ASSUME_UINT_ALIGNED(new_tail, alignment);
                    auto const user_storage = reinterpret_cast<void *>(new_tail);
                    new_tail = uint_upper_align(new_tail + size, s_alloc_granularity);

                    // check for page overflow
                    auto const page_start =
                      uint_lower_align(m_tail, ALLOCATOR_TYPE::page_alignment);
                    DENSITY_ASSUME(new_tail > page_start);
                    auto const new_tail_offset = new_tail - page_start;
                    if (DENSITY_LIKELY(new_tail_offset <= s_end_control_offset))
                    {
                        /* null-terminate the next control-block before updating the new one, to prevent
                        consumers from reaching an unitialized area. No memory ordering is required here */
                        raw_atomic_store(
                          &reinterpret_cast<ControlBlock *>(new_tail)->m_next,
                          uintptr_t(0),
                          mem_relaxed);
                        /* to investigate: this may probably be a non-atomic operation, because consumers can only
                            read this after acquiring the next write (to new_block->m_next). Anyway clang tsan
                            has reported it has a data race. Furthermore atomicity in this case should have no
                            consequences on the generated code. */

                        /* setup the new control block. Here we use release ordering so that consumers
                            acquiring this control block can see the previous write. */
                        auto const new_block = reinterpret_cast<ControlBlock *>(m_tail);
                        auto const next_ptr  = new_tail + CONTROL_BITS;
                        DENSITY_ASSERT_INTERNAL(
                          raw_atomic_load(&new_block->m_next, mem_relaxed) == 0);
                        raw_atomic_store(&new_block->m_next, next_ptr, mem_release);

                        // commit the allocation
                        m_tail = new_tail;
                        return {new_block, next_ptr, user_storage};
                    }
                    else if (can_fit_in_a_page) // if this allocation may fit in a page
                    {
                        /* allocate another page. Note: on success page_overflow sets m_tail to the beginning of
                            the new page */
                        auto const result = page_overflow(PROGRESS_GUARANTEE);
                        if (guarantee != LfQueue_Throwing)
                        {
                            if (result == 0)
                            {
                                return Allocation{};
                            }
                        }
                        else
                        {
                            // with LfQueue_Throwing page_overflow throws on failure
                            DENSITY_ASSUME(result != 0);
                        }
                    }
                    else // this allocation would never fit in a page, allocate an external block
                    {
                        // legacy heap allocations can only be blocking
                        if (guarantee == LfQueue_LockFree || guarantee == LfQueue_WaitFree)
                            return Allocation{};

                        return Base::template external_allocate<PROGRESS_GUARANTEE>(
                          CONTROL_BITS, size, alignment);
                    }
                }
            }